

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommand.cxx
# Opt level: O1

void __thiscall
cmCustomCommand::cmCustomCommand
          (cmCustomCommand *this,cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmCustomCommandLines *commandLines,char *comment,char *workingDirectory)

{
  size_t sVar1;
  char *pcVar2;
  cmListFileBacktrace local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Outputs,outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Byproducts,byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Depends,depends);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
            (&(this->CommandLines).
              super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
             &commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>)
  ;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace);
  (this->ImplicitDepends).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ImplicitDepends).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ImplicitDepends).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = "";
  if (comment != (char *)0x0) {
    pcVar2 = comment;
  }
  (this->Comment)._M_dataplus._M_p = (pointer)&(this->Comment).field_2;
  sVar1 = strlen(pcVar2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->Comment,pcVar2,pcVar2 + sVar1);
  pcVar2 = "";
  if (workingDirectory != (char *)0x0) {
    pcVar2 = workingDirectory;
  }
  (this->WorkingDirectory)._M_dataplus._M_p = (pointer)&(this->WorkingDirectory).field_2;
  sVar1 = strlen(pcVar2);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->WorkingDirectory,pcVar2,pcVar2 + sVar1);
  (this->Depfile)._M_dataplus._M_p = (pointer)&(this->Depfile).field_2;
  (this->Depfile)._M_string_length = 0;
  (this->Depfile).field_2._M_local_buf[0] = '\0';
  this->HaveComment = comment != (char *)0x0;
  this->EscapeAllowMakeVars = false;
  this->EscapeOldStyle = true;
  this->CommandExpandLists = false;
  if (mf != (cmMakefile *)0x0) {
    cmMakefile::GetBacktrace(&local_50,mf);
    cmListFileBacktrace::operator=(&this->Backtrace,&local_50);
    cmListFileBacktrace::~cmListFileBacktrace(&local_50);
  }
  return;
}

Assistant:

cmCustomCommand::cmCustomCommand(cmMakefile const* mf,
                                 const std::vector<std::string>& outputs,
                                 const std::vector<std::string>& byproducts,
                                 const std::vector<std::string>& depends,
                                 const cmCustomCommandLines& commandLines,
                                 const char* comment,
                                 const char* workingDirectory)
  : Outputs(outputs)
  , Byproducts(byproducts)
  , Depends(depends)
  , CommandLines(commandLines)
  , Backtrace()
  , Comment(comment ? comment : "")
  , WorkingDirectory(workingDirectory ? workingDirectory : "")
  , HaveComment(comment != CM_NULLPTR)
  , EscapeAllowMakeVars(false)
  , EscapeOldStyle(true)
  , CommandExpandLists(false)
{
  if (mf) {
    this->Backtrace = mf->GetBacktrace();
  }
}